

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O2

int Wln_ObjRange(Wln_Ntk_t *p,int i)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Wln_ObjRangeEnd(p,i);
  iVar2 = Wln_ObjRangeBeg(p,i);
  iVar1 = iVar1 - iVar2;
  iVar2 = -iVar1;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2 + 1;
}

Assistant:

static inline int          Wln_ObjRange( Wln_Ntk_t * p, int i )                  { return 1 + Abc_AbsInt(Wln_ObjRangeEnd(p, i)-Wln_ObjRangeBeg(p, i));        }